

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O2

string * toml::detail::format_underline
                   (string *__return_storage_ptr__,string *message,
                   vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *loc_com,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *helps,bool colorize)

{
  string *__rhs;
  pointer pbVar1;
  bool bVar2;
  __type_conflict1 _Var3;
  uint uVar4;
  ostream *poVar5;
  const_reference pvVar6;
  const_reference loc;
  char cVar7;
  pointer ppVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *help;
  pointer pbVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  detail *local_1c0;
  anon_class_8_1_5e3eab80 format_one_location;
  ostringstream retval;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar9;
  
  uVar14 = 0;
  for (ppVar8 = (loc_com->
                super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar8 != (loc_com->
                super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar8 = ppVar8 + 1) {
    uVar12 = 0;
    for (uVar4 = (ppVar8->first).line_num_; uVar4 != 0; uVar4 = uVar4 / 10) {
      uVar12 = uVar12 + 1;
    }
    if (uVar14 <= uVar12) {
      uVar14 = uVar12;
    }
  }
  sVar13 = uVar14 + (uVar14 == 0);
  local_1c8 = helps;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&retval);
  if ((colorize | color_ansi::detail::color_mode::status()::status_) == 1) {
    color_ansi::colorize((ostream *)&retval);
  }
  if (7 < message->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_1e8,(ulong)message);
    bVar2 = std::operator==(&local_1e8,"[error]");
    std::__cxx11::string::~string((string *)&local_1e8);
    if (bVar2) {
      poVar5 = color_ansi::bold((ostream *)&retval);
      poVar5 = color_ansi::red(poVar5);
      poVar5 = std::operator<<(poVar5,"[error]");
      poVar5 = color_ansi::reset(poVar5);
      poVar5 = color_ansi::bold(poVar5);
      std::__cxx11::string::substr((ulong)&local_1e8,(ulong)message);
      poVar5 = std::operator<<(poVar5,(string *)&local_1e8);
      poVar5 = color_ansi::reset(poVar5);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_1e8);
      goto LAB_0011e3c2;
    }
  }
  poVar5 = color_ansi::bold((ostream *)&retval);
  poVar5 = color_ansi::red(poVar5);
  poVar5 = std::operator<<(poVar5,"[error] ");
  poVar5 = color_ansi::reset(poVar5);
  poVar5 = color_ansi::bold(poVar5);
  poVar5 = std::operator<<(poVar5,(string *)message);
  poVar5 = color_ansi::reset(poVar5);
  std::operator<<(poVar5,'\n');
LAB_0011e3c2:
  format_one_location.line_num_width = sVar13;
  if ((loc_com->
      super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (loc_com->
      super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    poVar5 = color_ansi::bold((ostream *)&retval);
    poVar5 = color_ansi::blue(poVar5);
    poVar5 = std::operator<<(poVar5," --> ");
    poVar5 = color_ansi::reset(poVar5);
    pvVar9 = loc_com;
    poVar5 = std::operator<<(poVar5,(string *)
                                    &(((loc_com->
                                       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->first).
                                     file_name_);
    cVar7 = (char)pvVar9;
    std::operator<<(poVar5,'\n');
    make_string_abi_cxx11_(&local_1e8,(detail *)(sVar13 + 1),0x20,cVar7);
    local_1c0 = (detail *)(sVar13 + 1);
    poVar5 = std::operator<<((ostream *)&retval,(string *)&local_1e8);
    poVar5 = color_ansi::bold(poVar5);
    poVar5 = color_ansi::blue(poVar5);
    poVar5 = std::operator<<(poVar5," |\n");
    color_ansi::reset(poVar5);
    std::__cxx11::string::~string((string *)&local_1e8);
    ppVar8 = (loc_com->
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    format_underline::anon_class_8_1_5e3eab80::operator()
              (&format_one_location,&retval,&ppVar8->first,&ppVar8->second);
    uVar14 = 1;
    while( true ) {
      cVar7 = 'p';
      if ((ulong)(((long)(loc_com->
                         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(loc_com->
                        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar14) break;
      pvVar6 = std::
               vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(loc_com,uVar14 - 1);
      loc = std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(loc_com,uVar14);
      std::operator<<((ostream *)&retval,'\n');
      __rhs = &(loc->first).file_name_;
      _Var3 = std::operator==(&(pvVar6->first).file_name_,__rhs);
      if (_Var3) {
        poVar5 = color_ansi::bold((ostream *)&retval);
        poVar5 = color_ansi::blue(poVar5);
        poVar5 = std::operator<<(poVar5," ...\n");
        color_ansi::reset(poVar5);
      }
      else {
        poVar5 = color_ansi::bold((ostream *)&retval);
        poVar5 = color_ansi::blue(poVar5);
        poVar5 = std::operator<<(poVar5," --> ");
        poVar5 = color_ansi::reset(poVar5);
        poVar5 = std::operator<<(poVar5,(string *)__rhs);
        std::operator<<(poVar5,'\n');
        make_string_abi_cxx11_(&local_1e8,local_1c0,0x20,cVar7);
        poVar5 = std::operator<<((ostream *)&retval,(string *)&local_1e8);
        poVar5 = color_ansi::bold(poVar5);
        poVar5 = color_ansi::blue(poVar5);
        poVar5 = std::operator<<(poVar5," |\n");
        color_ansi::reset(poVar5);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      format_underline::anon_class_8_1_5e3eab80::operator()
                (&format_one_location,&retval,&loc->first,&loc->second);
      uVar14 = uVar14 + 1;
    }
    if ((local_1c8->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (local_1c8->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pvVar10 = local_1c8;
      std::operator<<((ostream *)&retval,'\n');
      make_string_abi_cxx11_(&local_1e8,local_1c0,0x20,(char)pvVar10);
      std::operator<<((ostream *)&retval,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      poVar5 = color_ansi::bold((ostream *)&retval);
      poVar5 = color_ansi::blue(poVar5);
      poVar5 = std::operator<<(poVar5," |");
      color_ansi::reset(poVar5);
      pbVar1 = (local_1c8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar11 = (local_1c8->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
          pbVar11 = pbVar11 + 1) {
        poVar5 = color_ansi::bold((ostream *)&retval);
        poVar5 = std::operator<<(poVar5,"\nHint: ");
        color_ansi::reset(poVar5);
        std::operator<<((ostream *)&retval,(string *)pbVar11);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&retval);
    return __return_storage_ptr__;
  }
  __assert_fail("!loc_com.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/source_location.hpp"
                ,0xbc,
                "std::string toml::detail::format_underline(const std::string &, const std::vector<std::pair<source_location, std::string>> &, const std::vector<std::string> &, const bool)"
               );
}

Assistant:

inline std::string format_underline(const std::string& message,
        const std::vector<std::pair<source_location, std::string>>& loc_com,
        const std::vector<std::string>& helps = {},
        const bool colorize = TOML11_ERROR_MESSAGE_COLORIZED)
{
    std::size_t line_num_width = 0;
    for(const auto& lc : loc_com)
    {
        std::uint_least32_t line = lc.first.line();
        std::size_t        digit = 0;
        while(line != 0)
        {
            line  /= 10;
            digit +=  1;
        }
        line_num_width = (std::max)(line_num_width, digit);
    }
    // 1 is the minimum width
    line_num_width = std::max<std::size_t>(line_num_width, 1);

    std::ostringstream retval;

    if(color::should_color() || colorize)
    {
        retval << color::colorize; // turn on ANSI color
    }

    // XXX
    // Here, before `colorize` support, it does not output `[error]` prefix
    // automatically. So some user may output it manually and this change may
    // duplicate the prefix. To avoid it, check the first 7 characters and
    // if it is "[error]", it removes that part from the message shown.
    if(message.size() > 7 && message.substr(0, 7) == "[error]")
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error]" << color::reset
#endif
               << color::bold << message.substr(7) << color::reset << '\n';
    }
    else
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error] " << color::reset
#endif
               << color::bold << message << color::reset << '\n';
    }

    const auto format_one_location = [line_num_width]
        (std::ostringstream& oss,
         const source_location& loc, const std::string& comment) -> void
        {
            oss << ' ' << color::bold << color::blue
                << std::setw(static_cast<int>(line_num_width))
                << std::right << loc.line() << " | "  << color::reset
                << loc.line_str() << '\n';

            oss << make_string(line_num_width + 1, ' ')
                << color::bold << color::blue << " | " << color::reset
                << make_string(loc.column()-1 /*1-origin*/, ' ');

            if(loc.region() == 1)
            {
                // invalid
                // ^------
                oss << color::bold << color::red << "^---" << color::reset;
            }
            else
            {
                // invalid
                // ~~~~~~~
                const auto underline_len = (std::min)(
                    static_cast<std::size_t>(loc.region()), loc.line_str().size());
                oss << color::bold << color::red
                    << make_string(underline_len, '~') << color::reset;
            }
            oss << ' ';
            oss << comment;
            return;
        };

    assert(!loc_com.empty());

    // --> example.toml
    //   |
    retval << color::bold << color::blue << " --> " << color::reset
           << loc_com.front().first.file_name() << '\n';
    retval << make_string(line_num_width + 1, ' ')
           << color::bold << color::blue << " |\n"  << color::reset;
    // 1 | key value
    //   |    ^--- missing =
    format_one_location(retval, loc_com.front().first, loc_com.front().second);

    // process the rest of the locations
    for(std::size_t i=1; i<loc_com.size(); ++i)
    {
        const auto& prev = loc_com.at(i-1);
        const auto& curr = loc_com.at(i);

        retval << '\n';
        // if the filenames are the same, print "..."
        if(prev.first.file_name() == curr.first.file_name())
        {
            retval << color::bold << color::blue << " ...\n" << color::reset;
        }
        else // if filename differs, print " --> filename.toml" again
        {
            retval << color::bold << color::blue << " --> " << color::reset
                   << curr.first.file_name() << '\n';
            retval << make_string(line_num_width + 1, ' ')
                   << color::bold << color::blue << " |\n"  << color::reset;
        }

        format_one_location(retval, curr.first, curr.second);
    }

    if(!helps.empty())
    {
        retval << '\n';
        retval << make_string(line_num_width + 1, ' ');
        retval << color::bold << color::blue << " |" << color::reset;
        for(const auto& help : helps)
        {
            retval << color::bold << "\nHint: " << color::reset;
            retval << help;
        }
    }
    return retval.str();
}